

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashUpdateEntry3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                       void *userdata,xmlHashDeallocator f)

{
  int iVar1;
  unsigned_long uVar2;
  xmlChar *pxVar3;
  _xmlHashEntry *local_58;
  xmlHashEntryPtr insert;
  xmlHashEntryPtr entry;
  unsigned_long key;
  xmlHashDeallocator f_local;
  void *userdata_local;
  xmlChar *name3_local;
  xmlChar *name2_local;
  xmlChar *name_local;
  xmlHashTablePtr table_local;
  
  if ((table == (xmlHashTablePtr)0x0) || (name == (xmlChar *)0x0)) {
    return -1;
  }
  userdata_local = name3;
  name3_local = name2;
  name2_local = name;
  if (table->dict != (xmlDictPtr)0x0) {
    iVar1 = xmlDictOwns(table->dict,name);
    if ((iVar1 == 0) &&
       (name2_local = xmlDictLookup(table->dict,name,-1), name2_local == (xmlChar *)0x0)) {
      return -1;
    }
    if (((name2 != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(table->dict,name2), iVar1 == 0)) &&
       (name3_local = xmlDictLookup(table->dict,name2,-1), name3_local == (xmlChar *)0x0)) {
      return -1;
    }
    if (((name3 != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(table->dict,name3), iVar1 == 0)) &&
       (userdata_local = xmlDictLookup(table->dict,name3,-1),
       (xmlChar *)userdata_local == (xmlChar *)0x0)) {
      return -1;
    }
  }
  uVar2 = xmlHashComputeKey(table,name2_local,name3_local,(xmlChar *)userdata_local);
  if (table->table[uVar2].valid == 0) {
    local_58 = (_xmlHashEntry *)0x0;
  }
  else if (table->dict == (xmlDictPtr)0x0) {
    for (local_58 = table->table + uVar2; local_58->next != (_xmlHashEntry *)0x0;
        local_58 = local_58->next) {
      iVar1 = xmlStrEqual(local_58->name,name2_local);
      if (((iVar1 != 0) && (iVar1 = xmlStrEqual(local_58->name2,name3_local), iVar1 != 0)) &&
         (iVar1 = xmlStrEqual(local_58->name3,(xmlChar *)userdata_local), iVar1 != 0)) {
        if (f != (xmlHashDeallocator)0x0) {
          (*f)(local_58->payload,local_58->name);
        }
        local_58->payload = userdata;
        return 0;
      }
    }
    iVar1 = xmlStrEqual(local_58->name,name2_local);
    if (((iVar1 != 0) && (iVar1 = xmlStrEqual(local_58->name2,name3_local), iVar1 != 0)) &&
       (iVar1 = xmlStrEqual(local_58->name3,(xmlChar *)userdata_local), iVar1 != 0)) {
      if (f != (xmlHashDeallocator)0x0) {
        (*f)(local_58->payload,local_58->name);
      }
      local_58->payload = userdata;
      return 0;
    }
  }
  else {
    for (local_58 = table->table + uVar2; local_58->next != (_xmlHashEntry *)0x0;
        local_58 = local_58->next) {
      if (((local_58->name == name2_local) && (local_58->name2 == name3_local)) &&
         (local_58->name3 == (xmlChar *)userdata_local)) {
        if (f != (xmlHashDeallocator)0x0) {
          (*f)(local_58->payload,local_58->name);
        }
        local_58->payload = userdata;
        return 0;
      }
    }
    if (((local_58->name == name2_local) && (local_58->name2 == name3_local)) &&
       (local_58->name3 == (xmlChar *)userdata_local)) {
      if (f != (xmlHashDeallocator)0x0) {
        (*f)(local_58->payload,local_58->name);
      }
      local_58->payload = userdata;
      return 0;
    }
  }
  if (local_58 == (_xmlHashEntry *)0x0) {
    insert = table->table + uVar2;
  }
  else {
    insert = (xmlHashEntryPtr)(*xmlMalloc)(0x30);
    if (insert == (xmlHashEntryPtr)0x0) {
      return -1;
    }
  }
  if (table->dict == (xmlDictPtr)0x0) {
    pxVar3 = xmlStrdup(name2_local);
    insert->name = pxVar3;
    pxVar3 = xmlStrdup(name3_local);
    insert->name2 = pxVar3;
    pxVar3 = xmlStrdup((xmlChar *)userdata_local);
    insert->name3 = pxVar3;
  }
  else {
    insert->name = name2_local;
    insert->name2 = name3_local;
    insert->name3 = (xmlChar *)userdata_local;
  }
  insert->payload = userdata;
  insert->next = (_xmlHashEntry *)0x0;
  insert->valid = 1;
  table->nbElems = table->nbElems + 1;
  if (local_58 != (_xmlHashEntry *)0x0) {
    local_58->next = insert;
  }
  return 0;
}

Assistant:

int
xmlHashUpdateEntry3(xmlHashTablePtr table, const xmlChar *name,
	           const xmlChar *name2, const xmlChar *name3,
		   void *userdata, xmlHashDeallocator f) {
    unsigned long key;
    xmlHashEntryPtr entry;
    xmlHashEntryPtr insert;

    if ((table == NULL) || name == NULL)
	return(-1);

    /*
     * If using a dict internalize if needed
     */
    if (table->dict) {
        if (!xmlDictOwns(table->dict, name)) {
	    name = xmlDictLookup(table->dict, name, -1);
	    if (name == NULL)
	        return(-1);
	}
        if ((name2 != NULL) && (!xmlDictOwns(table->dict, name2))) {
	    name2 = xmlDictLookup(table->dict, name2, -1);
	    if (name2 == NULL)
	        return(-1);
	}
        if ((name3 != NULL) && (!xmlDictOwns(table->dict, name3))) {
	    name3 = xmlDictLookup(table->dict, name3, -1);
	    if (name3 == NULL)
	        return(-1);
	}
    }

    /*
     * Check for duplicate and insertion location.
     */
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0) {
	insert = NULL;
    } else {
        if (table ->dict) {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((insert->name == name) &&
		    (insert->name2 == name2) &&
		    (insert->name3 == name3)) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((insert->name == name) &&
		(insert->name2 == name2) &&
		(insert->name3 == name3)) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	} else {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((xmlStrEqual(insert->name, name)) &&
		    (xmlStrEqual(insert->name2, name2)) &&
		    (xmlStrEqual(insert->name3, name3))) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((xmlStrEqual(insert->name, name)) &&
		(xmlStrEqual(insert->name2, name2)) &&
		(xmlStrEqual(insert->name3, name3))) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	}
    }

    if (insert == NULL) {
	entry =  &(table->table[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlHashEntry));
	if (entry == NULL)
	     return(-1);
    }

    if (table->dict != NULL) {
        entry->name = (xmlChar *) name;
        entry->name2 = (xmlChar *) name2;
        entry->name3 = (xmlChar *) name3;
    } else {
	entry->name = xmlStrdup(name);
	entry->name2 = xmlStrdup(name2);
	entry->name3 = xmlStrdup(name3);
    }
    entry->payload = userdata;
    entry->next = NULL;
    entry->valid = 1;
    table->nbElems++;


    if (insert != NULL) {
	insert->next = entry;
    }
    return(0);
}